

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cpp
# Opt level: O0

tm * pstore::gm_time(tm *__return_storage_ptr__,time_t clock)

{
  int *piVar1;
  errno_erc local_1c;
  tm *local_18;
  tm *res;
  time_t clock_local;
  
  res = (tm *)clock;
  piVar1 = __errno_location();
  *piVar1 = 0;
  memset(__return_storage_ptr__,0,0x38);
  local_18 = gmtime_r((time_t *)&res,(tm *)__return_storage_ptr__);
  if (local_18 == (tm *)0x0) {
    piVar1 = __errno_location();
    errno_erc::errno_erc(&local_1c,*piVar1);
    raise<pstore::errno_erc,char[9]>(local_1c,(char (*) [9])"gmtime_r");
  }
  if (local_18 == (tm *)__return_storage_ptr__) {
    return __return_storage_ptr__;
  }
  assert_failed("res == &result",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/os/time.cpp"
                ,0x41);
}

Assistant:

struct std::tm gm_time (std::time_t const clock) {
        errno = 0;
        struct tm result {};
        struct tm * const res = gmtime_r (&clock, &result);
        if (res == nullptr) {
            raise (errno_erc{errno}, "gmtime_r");
        }
        PSTORE_ASSERT (res == &result);
        return result;
    }